

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O3

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::Contains(S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *this_00;
  uint uVar1;
  bool bVar2;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_01;
  const_reference clipped;
  size_type_conflict n;
  bool bVar3;
  
  this_00 = &this->it_;
  bVar2 = S2ShapeIndex::Iterator::Locate(this_00,p);
  if (bVar2) {
    this_01 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(this_00);
    uVar1 = *(uint *)this_01;
    if ((uVar1 & 0xffffff) != 0) {
      n = 0;
      do {
        clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                  operator[](this_01,n);
        bVar2 = ShapeContains(this,this_00,clipped,p);
        if (bVar2) {
          return bVar2;
        }
        bVar3 = (uVar1 & 0xffffff) - 1 != n;
        n = n + 1;
      } while (bVar3);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::Contains(const S2Point& p) {
  if (!it_.Locate(p)) return false;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    if (ShapeContains(it_, cell.clipped(s), p)) return true;
  }
  return false;
}